

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

HighsInt __thiscall StabilizerOrbits::orbitalFixing(StabilizerOrbits *this,HighsDomain *domain)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer piVar6;
  pointer pHVar7;
  pointer pHVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  HighsInt HVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  HighsInt unaff_R13D;
  long lVar19;
  HighsDomainChange boundchg;
  
  iVar11 = HighsSymmetries::propagateOrbitopes(this->symmetries,domain);
  HVar14 = iVar11;
  if (((domain->infeasible_ == false) &&
      ((this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     (iVar12 = (int)((ulong)((long)(this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + -1, 0 < iVar12))
  {
    iVar17 = 0;
    do {
      lVar15 = (long)iVar17;
      piVar6 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = piVar6[lVar15];
      lVar19 = (long)iVar3;
      iVar4 = piVar6[lVar15 + 1];
      iVar13 = -1;
      if (iVar3 < iVar4) {
        lVar16 = lVar19;
        do {
          iVar13 = (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
          dVar2 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar13];
          pdVar1 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar13;
          if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_002fe40d;
          lVar16 = lVar16 + 1;
        } while (iVar4 != lVar16);
        iVar13 = -1;
      }
LAB_002fe40d:
      bVar9 = true;
      if (iVar13 != -1) {
        lVar15 = lVar15 + 1;
        pHVar7 = (domain->domchgstack_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        dVar2 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar13];
        iVar4 = (this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15];
        pHVar8 = (domain->domchgstack_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar9 = iVar3 < iVar4;
        iVar13 = iVar11;
        iVar18 = unaff_R13D;
        if ((dVar2 != 1.0) || (NAN(dVar2))) {
          if (iVar3 < iVar4) {
            do {
              uVar5 = (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar19];
              dVar2 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[(int)uVar5];
              if ((dVar2 != 0.0) || (NAN(dVar2))) {
                iVar13 = iVar13 + 1;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = (ulong)uVar5 + 0x100000000;
                HighsDomain::changeBound
                          (domain,(HighsDomainChange)(auVar10 << 0x40),(Reason)0xfffffffe);
                iVar18 = iVar13;
                if (domain->infeasible_ != false) break;
              }
              lVar19 = lVar19 + 1;
              lVar16 = (long)(this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar15];
              bVar9 = lVar19 < lVar16;
              iVar18 = unaff_R13D;
            } while (lVar19 < lVar16);
          }
        }
        else if (iVar3 < iVar4) {
          do {
            iVar3 = (this->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar19];
            dVar2 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[iVar3];
            if ((dVar2 != 1.0) || (NAN(dVar2))) {
              iVar13 = iVar13 + 1;
              boundchg.column = iVar3;
              boundchg.boundval = 1.0;
              boundchg.boundtype = kLower;
              HighsDomain::changeBound(domain,boundchg,(Reason)0xfffffffe);
              iVar18 = iVar13;
              if (domain->infeasible_ != false) break;
            }
            lVar19 = lVar19 + 1;
            lVar16 = (long)(this->orbitStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar15];
            bVar9 = lVar19 < lVar16;
            iVar18 = unaff_R13D;
          } while (lVar19 < lVar16);
        }
        unaff_R13D = iVar18;
        if (bVar9) {
          bVar9 = false;
          iVar11 = iVar13;
        }
        else {
          if (iVar13 != iVar11) {
            HighsDomain::propagate(domain);
            if (domain->infeasible_ != false) {
              bVar9 = false;
              iVar11 = iVar13;
              unaff_R13D = iVar13;
              goto LAB_002fe5c1;
            }
            if (iVar13 - iVar11 <
                (int)((ulong)((long)(domain->domchgstack_).
                                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(domain->domchgstack_).
                                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) -
                (int)((ulong)((long)pHVar7 - (long)pHVar8) >> 4)) {
              iVar17 = -1;
            }
          }
          bVar9 = true;
          iVar11 = iVar13;
        }
      }
LAB_002fe5c1:
      HVar14 = unaff_R13D;
    } while ((bVar9) && (iVar17 = iVar17 + 1, HVar14 = iVar11, iVar17 < iVar12));
  }
  return HVar14;
}

Assistant:

HighsInt StabilizerOrbits::orbitalFixing(HighsDomain& domain) const {
  HighsInt numFixed = symmetries->propagateOrbitopes(domain);
  if (domain.infeasible() || orbitCols.empty()) return numFixed;

  HighsInt numOrbits = orbitStarts.size() - 1;
  for (HighsInt i = 0; i < numOrbits; ++i) {
    HighsInt fixcol = -1;
    for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
      if (domain.isFixed(orbitCols[j])) {
        fixcol = orbitCols[j];
        break;
      }
    }

    if (fixcol != -1) {
      HighsInt oldNumFixed = numFixed;
      auto oldSize = domain.getDomainChangeStack().size();
      if (domain.col_lower_[fixcol] == 1.0) {
        for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
          if (domain.col_lower_[orbitCols[j]] == 1.0) continue;
          ++numFixed;
          domain.changeBound(HighsBoundType::kLower, orbitCols[j], 1.0,
                             HighsDomain::Reason::unspecified());
          if (domain.infeasible()) return numFixed;
        }
      } else {
        for (HighsInt j = orbitStarts[i]; j < orbitStarts[i + 1]; ++j) {
          if (domain.col_upper_[orbitCols[j]] == 0.0) continue;
          ++numFixed;
          domain.changeBound(HighsBoundType::kUpper, orbitCols[j], 0.0,
                             HighsDomain::Reason::unspecified());
          if (domain.infeasible()) return numFixed;
        }
      }

      HighsInt newFixed = numFixed - oldNumFixed;

      if (newFixed != 0) {
        domain.propagate();
        if (domain.infeasible()) return numFixed;
        if ((HighsInt)(domain.getDomainChangeStack().size() - oldSize) >
            newFixed)
          i = -1;
      }
    }
  }

  return numFixed;
}